

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.h
# Opt level: O0

void __thiscall
Js::JavascriptError::JavascriptError
          (JavascriptError *this,DynamicType *type,BOOL isExternalError,BOOL isPrototype)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  undefined4 *puVar4;
  nullptr_t local_30;
  nullptr_t local_28;
  BOOL local_20;
  BOOL local_1c;
  BOOL isPrototype_local;
  BOOL isExternalError_local;
  DynamicType *type_local;
  JavascriptError *this_local;
  
  local_20 = isPrototype;
  local_1c = isExternalError;
  _isPrototype_local = type;
  type_local = (DynamicType *)this;
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01e055b8;
  this->isExternalError = local_1c;
  this->isPrototype = local_20;
  this->isStackPropertyRedefined = false;
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierPtr
            (&this->originalRuntimeErrorMessage,&local_28);
  Memory::WriteBarrierPtr<Js::JavascriptExceptionObject>::WriteBarrierPtr(&this->exceptionObject);
  TVar3 = Js::Type::GetTypeId(&_isPrototype_local->super_Type);
  if (TVar3 != TypeIds_Error) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptError.h"
                                ,0x20,"(type->GetTypeId() == TypeIds_Error)",
                                "type->GetTypeId() == TypeIds_Error");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptExceptionObject>::operator=
            (&this->exceptionObject,&local_30);
  this->m_errorType = kjstCustomError;
  return;
}

Assistant:

JavascriptError(DynamicType* type, BOOL isExternalError = FALSE, BOOL isPrototype = FALSE) :
            DynamicObject(type), originalRuntimeErrorMessage(nullptr), isExternalError(isExternalError), isPrototype(isPrototype), isStackPropertyRedefined(false)
        {
            Assert(type->GetTypeId() == TypeIds_Error);
            exceptionObject = nullptr;
            m_errorType = kjstCustomError;
        }